

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool parse_address(char *cstr_addr,sockaddr_in *addr)

{
  ulong __n;
  size_t __n_00;
  sockaddr_in sVar1;
  string str_addr;
  char strip [1000];
  char strport [1000];
  
  std::__cxx11::string::string((string *)&str_addr,cstr_addr,(allocator *)strip);
  __n = std::__cxx11::string::find((char)&str_addr,0x3a);
  if (__n == 0xffffffffffffffff) {
    fwrite("Bad string\n",0xb,1,_stderr);
  }
  else {
    __n_00 = ~__n + str_addr._M_string_length;
    fprintf(_stderr,"%ld %ld %ld\n",__n,__n + 1,__n_00);
    strncpy(strip,cstr_addr,__n);
    strip[__n] = '\0';
    strncpy(strport,cstr_addr + __n + 1,__n_00);
    strport[__n_00] = '\0';
    sVar1 = get_address(strip,strport);
    *addr = sVar1;
  }
  std::__cxx11::string::~string((string *)&str_addr);
  return __n != 0xffffffffffffffff;
}

Assistant:

bool parse_address(char* cstr_addr, struct sockaddr_in &addr) {
    std::string str_addr(cstr_addr);
    size_t pos = str_addr.find(':');
    size_t len = str_addr.size();
    if (pos == std::string::npos) {
        fprintf(stderr, "Bad string\n");
        return false;
    }

    char strip[1000];
    char strport[1000];
    fprintf(stderr, "%ld %ld %ld\n", pos, pos + 1, len - pos - 1);
    strncpy(strip, cstr_addr, pos);
    strip[pos] = '\0';
    strncpy(strport, cstr_addr + pos + 1, len - pos - 1);
    strport[len - pos - 1] = '\0';

    addr = get_address(strip, strport);
    return true;
}